

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O0

Gia_Man_t * Acb_NtkGiaDeriveMiter(Gia_Man_t *pOne,Gia_Man_t *pTwo,int Type)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  bool bVar9;
  uint local_6c;
  uint local_68;
  int pLitsS_2 [2];
  int pLitsF_2 [2];
  int pLitsS_1 [2];
  int pLitsF_1 [2];
  int pLitsS [2];
  int pLitsF [2];
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int Type_local;
  Gia_Man_t *pTwo_local;
  Gia_Man_t *pOne_local;
  
  iVar2 = Gia_ManCiNum(pOne);
  iVar3 = Gia_ManCiNum(pTwo);
  if (iVar2 != iVar3) {
    __assert_fail("Gia_ManCiNum(pOne) == Gia_ManCiNum(pTwo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                  ,400,"Gia_Man_t *Acb_NtkGiaDeriveMiter(Gia_Man_t *, Gia_Man_t *, int)");
  }
  iVar2 = Gia_ManCoNum(pOne);
  iVar3 = Gia_ManCoNum(pTwo);
  if (iVar2 != iVar3) {
    __assert_fail("Gia_ManCoNum(pOne) == Gia_ManCoNum(pTwo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                  ,0x191,"Gia_Man_t *Acb_NtkGiaDeriveMiter(Gia_Man_t *, Gia_Man_t *, int)");
  }
  iVar2 = Gia_ManObjNum(pOne);
  iVar3 = Gia_ManObjNum(pTwo);
  iVar4 = Gia_ManCoNum(pOne);
  p = Gia_ManStart(iVar2 + iVar3 + (iVar4 * 5) / 2);
  pcVar6 = Abc_UtilStrsav("miter");
  p->pName = pcVar6;
  p->pSpec = (char *)0x0;
  Gia_ManHashAlloc(p);
  pGVar7 = Gia_ManConst0(pOne);
  pGVar7->Value = 0;
  pGVar7 = Gia_ManConst0(pTwo);
  pGVar7->Value = 0;
  pLitsF[0] = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pOne->vCis);
    bVar9 = false;
    if (pLitsF[0] < iVar2) {
      register0x00000000 = Gia_ManCi(pOne,pLitsF[0]);
      bVar9 = register0x00000000 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar5 = Gia_ManAppendCi(p);
    stack0xffffffffffffffc8->Value = uVar5;
    pLitsF[0] = pLitsF[0] + 1;
  }
  pLitsF[0] = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pTwo->vCis);
    bVar9 = false;
    if (pLitsF[0] < iVar2) {
      register0x00000000 = Gia_ManCi(pTwo,pLitsF[0]);
      bVar9 = register0x00000000 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    pGVar7 = Gia_ManCi(pOne,pLitsF[0]);
    stack0xffffffffffffffc8->Value = pGVar7->Value;
    pLitsF[0] = pLitsF[0] + 1;
  }
  pLitsF[0] = 0;
  while( true ) {
    bVar9 = false;
    if (pLitsF[0] < pOne->nObjs) {
      register0x00000000 = Gia_ManObj(pOne,pLitsF[0]);
      bVar9 = register0x00000000 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    iVar2 = Gia_ObjIsAnd(stack0xffffffffffffffc8);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjFanin0Copy(stack0xffffffffffffffc8);
      iVar3 = Gia_ObjFanin1Copy(stack0xffffffffffffffc8);
      uVar5 = Gia_ManHashAnd(p,iVar2,iVar3);
      stack0xffffffffffffffc8->Value = uVar5;
    }
    pLitsF[0] = pLitsF[0] + 1;
  }
  pLitsF[0] = 0;
  while( true ) {
    bVar9 = false;
    if (pLitsF[0] < pTwo->nObjs) {
      register0x00000000 = Gia_ManObj(pTwo,pLitsF[0]);
      bVar9 = register0x00000000 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    iVar2 = Gia_ObjIsAnd(stack0xffffffffffffffc8);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjFanin0Copy(stack0xffffffffffffffc8);
      iVar3 = Gia_ObjFanin1Copy(stack0xffffffffffffffc8);
      uVar5 = Gia_ManHashAnd(p,iVar2,iVar3);
      stack0xffffffffffffffc8->Value = uVar5;
    }
    pLitsF[0] = pLitsF[0] + 1;
  }
  pLitsF[0] = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pOne->vCos);
    bVar9 = false;
    if (pLitsF[0] < iVar2) {
      register0x00000000 = Gia_ManCo(pOne,pLitsF[0]);
      bVar9 = register0x00000000 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar5 = Gia_ObjFanin0Copy(stack0xffffffffffffffc8);
    stack0xffffffffffffffc8->Value = uVar5;
    pLitsF[0] = pLitsF[0] + 1;
  }
  pLitsF[0] = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pTwo->vCos);
    bVar9 = false;
    if (pLitsF[0] < iVar2) {
      register0x00000000 = Gia_ManCo(pTwo,pLitsF[0]);
      bVar9 = register0x00000000 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar5 = Gia_ObjFanin0Copy(stack0xffffffffffffffc8);
    stack0xffffffffffffffc8->Value = uVar5;
    pLitsF[0] = pLitsF[0] + 1;
  }
  if (Type == 0) {
    for (pLitsF[0] = 0; iVar2 = Gia_ManCoNum(pOne), pLitsF[0] < iVar2; pLitsF[0] = pLitsF[0] + 2) {
      pGVar7 = Gia_ManCo(pOne,pLitsF[0]);
      uVar5 = pGVar7->Value;
      Gia_ManCo(pOne,pLitsF[0] + 1);
      pGVar7 = Gia_ManCo(pTwo,pLitsF[0]);
      uVar1 = pGVar7->Value;
      Gia_ManCo(pTwo,pLitsF[0] + 1);
      Gia_ManAppendCo(p,uVar5);
      Gia_ManAppendCo(p,uVar1);
    }
  }
  else if (Type == 1) {
    for (pLitsF[0] = 0; iVar2 = Gia_ManCoNum(pOne), pLitsF[0] < iVar2; pLitsF[0] = pLitsF[0] + 2) {
      Gia_ManCo(pOne,pLitsF[0]);
      pGVar7 = Gia_ManCo(pOne,pLitsF[0] + 1);
      uVar5 = pGVar7->Value;
      Gia_ManCo(pTwo,pLitsF[0]);
      pGVar7 = Gia_ManCo(pTwo,pLitsF[0] + 1);
      uVar1 = pGVar7->Value;
      Gia_ManAppendCo(p,uVar5);
      Gia_ManAppendCo(p,uVar1);
    }
  }
  else {
    for (pLitsF[0] = 0; iVar2 = Gia_ManCoNum(pOne), pLitsF[0] < iVar2; pLitsF[0] = pLitsF[0] + 2) {
      pGVar7 = Gia_ManCo(pOne,pLitsF[0]);
      pLitsS_2[0] = pGVar7->Value;
      pGVar7 = Gia_ManCo(pOne,pLitsF[0] + 1);
      pLitsS_2[1] = pGVar7->Value;
      pGVar7 = Gia_ManCo(pTwo,pLitsF[0]);
      local_6c = pGVar7->Value;
      pGVar7 = Gia_ManCo(pTwo,pLitsF[0] + 1);
      local_68 = pGVar7->Value;
      iVar2 = Gia_ManDualCompare(p,pLitsS_2,(int *)&local_6c);
      Gia_ManAppendCo(p,iVar2);
    }
  }
  Gia_ManHashStop(p);
  pGVar8 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar8;
}

Assistant:

Gia_Man_t * Acb_NtkGiaDeriveMiter( Gia_Man_t * pOne, Gia_Man_t * pTwo, int Type )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManCiNum(pOne) == Gia_ManCiNum(pTwo) );
    assert( Gia_ManCoNum(pOne) == Gia_ManCoNum(pTwo) );
    pNew = Gia_ManStart( Gia_ManObjNum(pOne) + Gia_ManObjNum(pTwo) + 5*Gia_ManCoNum(pOne)/2 );
    pNew->pName = Abc_UtilStrsav( "miter" );
    pNew->pSpec = NULL;
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(pOne)->Value = 0;
    Gia_ManConst0(pTwo)->Value = 0;
    Gia_ManForEachCi( pOne, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( pTwo, pObj, i )
        pObj->Value = Gia_ManCi(pOne, i)->Value;
    Gia_ManForEachAnd( pOne, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachAnd( pTwo, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pOne, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachCo( pTwo, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    if ( Type == 0 ) // only main circuit
    {
        for ( i = 0; i < Gia_ManCoNum(pOne); i += 2 )
        {
            int pLitsF[2] = { Gia_ManCo(pOne, i)->Value, Gia_ManCo(pOne, i+1)->Value };
            int pLitsS[2] = { Gia_ManCo(pTwo, i)->Value, Gia_ManCo(pTwo, i+1)->Value };
            Gia_ManAppendCo( pNew, pLitsF[0] );
            Gia_ManAppendCo( pNew, pLitsS[0] );
        }
    }
    else if ( Type == 1 ) // only shadow circuit
    {
        for ( i = 0; i < Gia_ManCoNum(pOne); i += 2 )
        {
            int pLitsF[2] = { Gia_ManCo(pOne, i)->Value, Gia_ManCo(pOne, i+1)->Value };
            int pLitsS[2] = { Gia_ManCo(pTwo, i)->Value, Gia_ManCo(pTwo, i+1)->Value };
            Gia_ManAppendCo( pNew, pLitsF[1] );
            Gia_ManAppendCo( pNew, pLitsS[1] );
        }
    }
    else // comparator of the two
    {
        for ( i = 0; i < Gia_ManCoNum(pOne); i += 2 )
        {
            int pLitsF[2] = { Gia_ManCo(pOne, i)->Value, Gia_ManCo(pOne, i+1)->Value };
            int pLitsS[2] = { Gia_ManCo(pTwo, i)->Value, Gia_ManCo(pTwo, i+1)->Value };
            Gia_ManAppendCo( pNew, Gia_ManDualCompare( pNew, pLitsF, pLitsS ) );
        }
    }
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}